

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2_tc.c
# Opt level: O1

void olsrv2_tc_node_remove(olsrv2_tc_node *node)

{
  list_entity *plVar1;
  list_entity *plVar2;
  list_entity *plVar3;
  
  oonf_class_event(&_tc_node_class,node,OONF_OBJECT_REMOVED);
  plVar3 = (node->_edges).list_head.next;
  plVar2 = plVar3->prev;
  while (plVar2 != (node->_edges).list_head.prev) {
    plVar1 = plVar3->next;
    olsrv2_routing_domain_changed((nhdp_domain *)0x0,true);
    _remove_edge((olsrv2_tc_edge *)(plVar3 + -3),true);
    plVar3 = plVar1;
    plVar2 = plVar1->prev;
  }
  plVar3 = (node->_attached_networks).list_head.next;
  plVar2 = plVar3->prev;
  while (plVar2 != (node->_attached_networks).list_head.prev) {
    plVar1 = plVar3->next;
    olsrv2_tc_endpoint_remove((olsrv2_tc_attachment *)&plVar3[-3].prev);
    plVar3 = plVar1;
    plVar2 = plVar1->prev;
  }
  oonf_timer_stop(&node->_validity_time);
  if (((node->_edges).count == 0) && (node->direct_neighbor == false)) {
    avl_remove(&_tc_tree,&node->_originator_node);
    oonf_class_free(&_tc_node_class,node);
  }
  olsrv2_routing_domain_changed((nhdp_domain *)0x0,true);
  return;
}

Assistant:

void
olsrv2_tc_node_remove(struct olsrv2_tc_node *node) {
  struct olsrv2_tc_edge *edge, *edge_it;
  struct olsrv2_tc_attachment *net, *net_it;

  oonf_class_event(&_tc_node_class, node, OONF_OBJECT_REMOVED);

  /* remove tc_edges */
  avl_for_each_element_safe(&node->_edges, edge, _node, edge_it) {
    /* some edges might just become virtual */
    olsrv2_tc_edge_remove(edge);
  }

  /* remove attached networks */
  avl_for_each_element_safe(&node->_attached_networks, net, _src_node, net_it) {
    olsrv2_tc_endpoint_remove(net);
  }

  /* stop validity timer */
  oonf_timer_stop(&node->_validity_time);

  /* remove from global tree and free memory if node is not needed anymore*/
  if (node->_edges.count == 0 && !node->direct_neighbor) {
    avl_remove(&_tc_tree, &node->_originator_node);
    oonf_class_free(&_tc_node_class, node);
  }

  /* all domains might have changed */
  olsrv2_routing_domain_changed(NULL, true);
}